

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::String> __thiscall
kj::AsyncInputStream::readAllText(AsyncInputStream *this,uint64_t limit)

{
  AllReader *limit_00;
  undefined1 local_38 [8];
  Promise<kj::String> promise;
  Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> reader;
  uint64_t limit_local;
  AsyncInputStream *this_local;
  
  heap<kj::(anonymous_namespace)::AllReader,kj::AsyncInputStream&>
            ((kj *)&promise,(AsyncInputStream *)limit);
  limit_00 = Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t>::operator->
                       ((Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> *)&promise);
  anon_unknown_123::AllReader::readAllText((AllReader *)local_38,(uint64_t)limit_00);
  mv<kj::Own<kj::(anonymous_namespace)::AllReader,decltype(nullptr)>>
            ((Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> *)&promise);
  Promise<kj::String>::attach<kj::Own<kj::(anonymous_namespace)::AllReader,decltype(nullptr)>>
            ((Promise<kj::String> *)this,
             (Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> *)local_38);
  Promise<kj::String>::~Promise((Promise<kj::String> *)local_38);
  Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> *)&promise);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<String> AsyncInputStream::readAllText(uint64_t limit) {
  auto reader = kj::heap<AllReader>(*this);
  auto promise = reader->readAllText(limit);
  return promise.attach(kj::mv(reader));
}